

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Token * __thiscall
jsonnet::internal::anon_unknown_0::Parser::parseObjectRemainder(Parser *this,AST **obj,Token *tok)

{
  bool bVar1;
  Object *pOVar2;
  undefined8 uVar3;
  ObjectComprehension *pOVar4;
  Token *pTVar5;
  undefined8 *in_RDX;
  long in_RSI;
  Token *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  pair<std::_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>,_bool> pVar7;
  Fodder comma_fodder_2;
  Token colon;
  Fodder colon_fodder;
  AST *msg_4;
  AST *cond;
  Fodder assert_fodder;
  Fodder comma_fodder_1;
  AST *body_1;
  Token eq;
  Token paren_l_1;
  Fodder paren_r_fodder;
  Fodder paren_l_fodder;
  ArgParams params_1;
  bool func_comma;
  bool is_method_1;
  Identifier *id_1;
  Token var_id;
  Fodder local_fodder;
  Fodder comma_fodder;
  AST *body;
  Hide field_hide;
  uint colons;
  char *od;
  Token op;
  bool plus_sugar;
  Token paren_l;
  Fodder fodder_r;
  Fodder fodder_l;
  ArgParams params;
  bool meth_comma;
  bool is_method;
  Token bracket_r;
  LocationRange idLocation;
  Fodder fodder2;
  Fodder fodder1;
  Identifier *id;
  AST *expr1;
  Kind kind;
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  specs;
  char *msg_3;
  char *msg_2;
  ObjectField *field;
  char *msg_1;
  char *msg;
  ObjectField *field_1;
  iterator __end6;
  iterator __begin6;
  ObjectFields *__range6;
  ObjectField *field_ptr;
  uint num_asserts;
  uint num_fields;
  Token next;
  bool first;
  bool got_comma;
  set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  binds;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  literal_fields;
  ObjectFields fields;
  Token *last;
  value_type *in_stack_ffffffffffffe948;
  ObjectField *in_stack_ffffffffffffe950;
  Token *in_stack_ffffffffffffe958;
  undefined4 uVar8;
  LocationRange *in_stack_ffffffffffffe960;
  AST *in_stack_ffffffffffffe968;
  StaticError *in_stack_ffffffffffffe970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe978;
  UString *in_stack_ffffffffffffe980;
  Allocator *in_stack_ffffffffffffe988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe990;
  LocationRange *in_stack_ffffffffffffe998;
  Allocator *in_stack_ffffffffffffe9a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe9b0;
  AST *in_stack_ffffffffffffe9b8;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_ffffffffffffe9e8;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_ffffffffffffe9f0;
  iterator in_stack_ffffffffffffe9f8;
  value_type *in_stack_ffffffffffffea00;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_ffffffffffffea08;
  TokenKind *in_stack_ffffffffffffea10;
  AST *in_stack_ffffffffffffea18;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_ffffffffffffea20;
  LocationRange *in_stack_ffffffffffffea28;
  undefined7 in_stack_ffffffffffffea30;
  byte in_stack_ffffffffffffea37;
  char (*in_stack_ffffffffffffea40) [1];
  undefined4 in_stack_ffffffffffffea60;
  undefined2 uVar9;
  undefined1 in_stack_ffffffffffffea66;
  undefined1 in_stack_ffffffffffffea67;
  Fodder *in_stack_ffffffffffffea68;
  Fodder *in_stack_ffffffffffffea70;
  Fodder *in_stack_ffffffffffffea78;
  LiteralString *in_stack_ffffffffffffea80;
  LiteralString *in_stack_ffffffffffffea88;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
  *in_stack_ffffffffffffea90;
  Fodder *in_stack_ffffffffffffea98;
  Fodder *in_stack_ffffffffffffeaa0;
  LiteralString *in_stack_ffffffffffffeaa8;
  AST *in_stack_ffffffffffffeab0;
  Parser *in_stack_ffffffffffffeab8;
  AST *in_stack_ffffffffffffeac0;
  LiteralString *in_stack_ffffffffffffeac8;
  Fodder *in_stack_ffffffffffffead8;
  AST *in_stack_ffffffffffffeae0;
  LiteralString *in_stack_ffffffffffffeae8;
  string *in_stack_ffffffffffffeb28;
  Token *in_stack_ffffffffffffeb30;
  undefined4 in_stack_ffffffffffffeb38;
  char *in_stack_ffffffffffffed28;
  Kind in_stack_ffffffffffffed34;
  Parser *in_stack_ffffffffffffed38;
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  *in_stack_ffffffffffffeeb0;
  Fodder *in_stack_ffffffffffffeeb8;
  Kind in_stack_ffffffffffffeec4;
  Parser *in_stack_ffffffffffffeec8;
  undefined1 local_d70 [247];
  allocator<char> local_c79;
  string local_c78 [296];
  ObjectField local_b50;
  LocationRange local_a00 [6];
  Allocator local_878;
  _Base_ptr local_830;
  byte local_828;
  _Base_ptr local_820;
  byte local_818;
  undefined1 local_809;
  undefined1 local_7e1;
  undefined1 local_7c0 [254];
  undefined1 local_6c2;
  undefined1 local_6c1 [297];
  undefined1 local_598 [31];
  Token local_579;
  undefined4 local_4b4;
  undefined4 local_48c;
  undefined4 local_464;
  undefined4 local_43c;
  undefined4 local_414;
  StaticError local_3d0;
  undefined1 local_360 [8];
  LiteralString *local_358;
  int local_350;
  undefined1 local_34a;
  undefined1 local_2c9;
  undefined1 local_2aa;
  char *local_288;
  undefined1 local_27a;
  char *local_258;
  reference local_250;
  undefined1 local_242;
  char *local_220;
  undefined1 local_212;
  char *local_1f0;
  reference local_1e8;
  ObjectField *local_1e0;
  __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
  local_1d8;
  undefined1 *local_1d0;
  reference local_1c8;
  int local_1bc;
  int local_1b8;
  undefined4 local_1b4;
  int local_160;
  undefined1 local_158 [120];
  Fodder local_e0 [2];
  byte local_9a;
  byte local_99;
  undefined1 local_38 [32];
  undefined8 *local_18;
  
  local_18 = in_RDX;
  std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
  vector((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_> *)
         0x20bab7);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x20bac4);
  std::
  set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
         *)0x20bad1);
  local_99 = 0;
  local_9a = 1;
  pop((Parser *)in_stack_ffffffffffffe968);
  do {
    if (local_160 == 1) {
      span(in_stack_ffffffffffffe958,(Token *)in_stack_ffffffffffffe950);
      pOVar2 = Allocator::
               make<jsonnet::internal::Object,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ObjectField,std::allocator<jsonnet::internal::ObjectField>>&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                         (in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_ffffffffffffe990,
                          (vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                           *)in_stack_ffffffffffffe988,(bool *)in_stack_ffffffffffffe980,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_ffffffffffffe978);
      *local_18 = pOVar2;
      LocationRange::~LocationRange((LocationRange *)0x20bb9e);
      Token::Token((Token *)in_stack_ffffffffffffe950,(Token *)in_stack_ffffffffffffe948);
      local_1b4 = 1;
LAB_0020e11a:
      Token::~Token((Token *)in_stack_ffffffffffffe950);
      std::
      set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
              *)0x20e134);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x20e141);
      std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
      ~vector((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
               *)in_stack_ffffffffffffe960);
      return in_RDI;
    }
    if (local_160 == 0x16) {
      local_1b8 = 0;
      local_1bc = 0;
      local_1c8 = (reference)0x0;
      local_1d0 = local_38;
      local_1d8._M_current =
           (ObjectField *)
           std::
           vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
           begin((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                  *)in_stack_ffffffffffffe948);
      local_1e0 = (ObjectField *)
                  std::
                  vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                  ::end((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                         *)in_stack_ffffffffffffe948);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                                 *)in_stack_ffffffffffffe950,
                                (__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                                 *)in_stack_ffffffffffffe948), bVar1) {
        local_1e8 = __gnu_cxx::
                    __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                    ::operator*(&local_1d8);
        if (local_1e8->kind != LOCAL) {
          if (local_1e8->kind == ASSERT) {
            local_1bc = local_1bc + 1;
          }
          else {
            local_1b8 = local_1b8 + 1;
            local_1c8 = local_1e8;
          }
        }
        __gnu_cxx::
        __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
        ::operator++(&local_1d8);
      }
      if (local_1bc != 0) {
        local_1f0 = "object comprehension cannot have asserts.";
        local_212 = 1;
        uVar3 = __cxa_allocate_exception(0x60);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffe990,(char *)in_stack_ffffffffffffe988,
                   (allocator<char> *)in_stack_ffffffffffffe980);
        StaticError::StaticError
                  (in_stack_ffffffffffffe970,(LocationRange *)in_stack_ffffffffffffe968,
                   &in_stack_ffffffffffffe960->file);
        local_212 = 0;
        __cxa_throw(uVar3,&StaticError::typeinfo,StaticError::~StaticError);
      }
      if (local_1b8 != 1) {
        local_220 = "object comprehension can only have one field.";
        local_242 = 1;
        uVar3 = __cxa_allocate_exception(0x60);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffe990,(char *)in_stack_ffffffffffffe988,
                   (allocator<char> *)in_stack_ffffffffffffe980);
        StaticError::StaticError
                  (in_stack_ffffffffffffe970,(LocationRange *)in_stack_ffffffffffffe968,
                   &in_stack_ffffffffffffe960->file);
        local_242 = 0;
        __cxa_throw(uVar3,&StaticError::typeinfo,StaticError::~StaticError);
      }
      local_250 = local_1c8;
      if (local_1c8->hide != INHERIT) {
        local_258 = "object comprehensions cannot have hidden fields.";
        local_27a = 1;
        uVar3 = __cxa_allocate_exception(0x60);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffe990,(char *)in_stack_ffffffffffffe988,
                   (allocator<char> *)in_stack_ffffffffffffe980);
        StaticError::StaticError
                  (in_stack_ffffffffffffe970,(LocationRange *)in_stack_ffffffffffffe968,
                   &in_stack_ffffffffffffe960->file);
        local_27a = 0;
        __cxa_throw(uVar3,&StaticError::typeinfo,StaticError::~StaticError);
      }
      if (local_1c8->kind != FIELD_EXPR) {
        local_288 = "object comprehensions can only have [e] fields.";
        local_2aa = 1;
        uVar3 = __cxa_allocate_exception(0x60);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffe990,(char *)in_stack_ffffffffffffe988,
                   (allocator<char> *)in_stack_ffffffffffffe980);
        StaticError::StaticError
                  (in_stack_ffffffffffffe970,(LocationRange *)in_stack_ffffffffffffe968,
                   &in_stack_ffffffffffffe960->file);
        local_2aa = 0;
        __cxa_throw(uVar3,&StaticError::typeinfo,StaticError::~StaticError);
      }
      std::
      vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
      ::vector((vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                *)0x20c20b);
      local_2c9 = 0;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_stack_ffffffffffffe9a0,
             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_stack_ffffffffffffe998);
      parseComprehensionSpecs
                (in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec4,in_stack_ffffffffffffeeb8,
                 in_stack_ffffffffffffeeb0);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_ffffffffffffe960);
      span(in_stack_ffffffffffffe958,(Token *)in_stack_ffffffffffffe950);
      pOVar4 = Allocator::
               make<jsonnet::internal::ObjectComprehension,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ObjectField,std::allocator<jsonnet::internal::ObjectField>>&,bool&,std::vector<jsonnet::internal::ComprehensionSpec,std::allocator<jsonnet::internal::ComprehensionSpec>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                         (in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_ffffffffffffe990,
                          (vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                           *)in_stack_ffffffffffffe988,(bool *)in_stack_ffffffffffffe980,
                          (vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                           *)in_stack_ffffffffffffe978,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_ffffffffffffe9b0);
      *local_18 = pOVar4;
      LocationRange::~LocationRange((LocationRange *)0x20c30b);
      local_1b4 = 1;
      local_2c9 = 1;
      std::
      vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
      ::~vector((vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                 *)in_stack_ffffffffffffe960);
      goto LAB_0020e11a;
    }
    if (((local_99 & 1) == 0) && ((local_9a & 1) == 0)) {
      local_34a = 1;
      uVar3 = __cxa_allocate_exception(0x60);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe990,(char *)in_stack_ffffffffffffe988,
                 (allocator<char> *)in_stack_ffffffffffffe980);
      StaticError::StaticError
                (in_stack_ffffffffffffe970,(LocationRange *)in_stack_ffffffffffffe968,
                 &in_stack_ffffffffffffe960->file);
      local_34a = 0;
      __cxa_throw(uVar3,&StaticError::typeinfo,StaticError::~StaticError);
    }
    local_9a = 0;
    local_99 = 0;
    if (((local_160 == 2) || (local_160 == 10)) || (local_160 - 0xdU < 5)) {
      local_358 = (LiteralString *)0x0;
      local_360 = (undefined1  [8])0x0;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x20c595);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x20c5a2);
      LocationRange::LocationRange(in_stack_ffffffffffffe960);
      if (local_160 == 10) {
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8);
        local_350 = 1;
        in_stack_ffffffffffffeb30 = *(Token **)(in_RSI + 8);
        Token::data32_abi_cxx11_((Token *)in_stack_ffffffffffffe948);
        in_stack_ffffffffffffeb28 =
             (string *)
             Allocator::makeIdentifier(in_stack_ffffffffffffe988,in_stack_ffffffffffffe980);
        local_360 = (undefined1  [8])in_stack_ffffffffffffeb28;
        std::__cxx11::u32string::~u32string
                  ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                   in_stack_ffffffffffffe950);
        LocationRange::operator=
                  ((LocationRange *)in_stack_ffffffffffffe950,
                   (LocationRange *)in_stack_ffffffffffffe948);
      }
      else if (local_160 == 0xd) {
        local_350 = 3;
        Token::data32_abi_cxx11_((Token *)in_stack_ffffffffffffe948);
        local_414 = 1;
        in_stack_ffffffffffffe948 = (value_type *)0x2271dd;
        local_358 = Allocator::
                    make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                              ((Allocator *)
                               CONCAT17(in_stack_ffffffffffffea37,in_stack_ffffffffffffea30),
                               in_stack_ffffffffffffea28,in_stack_ffffffffffffea20,
                               (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                *)in_stack_ffffffffffffea18,in_stack_ffffffffffffea10,
                               (char (*) [1])in_stack_ffffffffffffea08,in_stack_ffffffffffffea40);
        std::__cxx11::u32string::~u32string
                  ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                   in_stack_ffffffffffffe950);
      }
      else if (local_160 == 0xe) {
        local_350 = 3;
        Token::data32_abi_cxx11_((Token *)in_stack_ffffffffffffe948);
        local_43c = 0;
        in_stack_ffffffffffffe948 = (value_type *)0x2271dd;
        in_stack_ffffffffffffeae8 =
             Allocator::
             make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                       ((Allocator *)CONCAT17(in_stack_ffffffffffffea37,in_stack_ffffffffffffea30),
                        in_stack_ffffffffffffea28,in_stack_ffffffffffffea20,
                        (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)in_stack_ffffffffffffea18,in_stack_ffffffffffffea10,
                        (char (*) [1])in_stack_ffffffffffffea08,in_stack_ffffffffffffea40);
        local_358 = in_stack_ffffffffffffeae8;
        std::__cxx11::u32string::~u32string
                  ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                   in_stack_ffffffffffffe950);
      }
      else if (local_160 == 0xf) {
        local_350 = 3;
        in_stack_ffffffffffffead8 = local_e0;
        in_stack_ffffffffffffeae0 = (AST *)local_158;
        Token::data32_abi_cxx11_((Token *)in_stack_ffffffffffffe948);
        local_464 = 2;
        in_stack_ffffffffffffe948 = (value_type *)(local_158 + 0x58);
        in_stack_ffffffffffffeac8 =
             Allocator::
             make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,std::__cxx11::string&,std::__cxx11::string&>
                       (in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)in_stack_ffffffffffffe990,
                        (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)in_stack_ffffffffffffe988,(TokenKind *)in_stack_ffffffffffffe980,
                        in_stack_ffffffffffffe978,in_stack_ffffffffffffe9b0);
        local_358 = in_stack_ffffffffffffeac8;
        std::__cxx11::u32string::~u32string
                  ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                   in_stack_ffffffffffffe950);
      }
      else if (local_160 == 0x10) {
        local_350 = 3;
        in_stack_ffffffffffffeab0 = *(AST **)(in_RSI + 8);
        in_stack_ffffffffffffeab8 = (Parser *)local_e0;
        in_stack_ffffffffffffeac0 = (AST *)local_158;
        Token::data32_abi_cxx11_((Token *)in_stack_ffffffffffffe948);
        local_48c = 3;
        in_stack_ffffffffffffe948 = (value_type *)0x2271dd;
        in_stack_ffffffffffffeaa8 =
             Allocator::
             make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                       ((Allocator *)CONCAT17(in_stack_ffffffffffffea37,in_stack_ffffffffffffea30),
                        in_stack_ffffffffffffea28,in_stack_ffffffffffffea20,
                        (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)in_stack_ffffffffffffea18,in_stack_ffffffffffffea10,
                        (char (*) [1])in_stack_ffffffffffffea08,in_stack_ffffffffffffea40);
        local_358 = in_stack_ffffffffffffeaa8;
        std::__cxx11::u32string::~u32string
                  ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                   in_stack_ffffffffffffe950);
      }
      else if (local_160 == 0x11) {
        local_350 = 3;
        in_stack_ffffffffffffea90 =
             *(vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> **)
              (in_RSI + 8);
        in_stack_ffffffffffffea98 = local_e0;
        in_stack_ffffffffffffeaa0 = (Fodder *)local_158;
        Token::data32_abi_cxx11_((Token *)in_stack_ffffffffffffe948);
        local_4b4 = 4;
        in_stack_ffffffffffffe948 = (value_type *)0x2271dd;
        in_stack_ffffffffffffea88 =
             Allocator::
             make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                       ((Allocator *)CONCAT17(in_stack_ffffffffffffea37,in_stack_ffffffffffffea30),
                        in_stack_ffffffffffffea28,in_stack_ffffffffffffea20,
                        (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)in_stack_ffffffffffffea18,in_stack_ffffffffffffea10,
                        (char (*) [1])in_stack_ffffffffffffea08,in_stack_ffffffffffffea40);
        local_358 = in_stack_ffffffffffffea88;
        std::__cxx11::u32string::~u32string
                  ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                   in_stack_ffffffffffffe950);
      }
      else {
        local_350 = 2;
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8);
        in_stack_ffffffffffffea80 =
             (LiteralString *)
             parse((Parser *)in_stack_ffffffffffffe9b8,
                   (uint)((ulong)in_stack_ffffffffffffe9b0 >> 0x20));
        local_358 = in_stack_ffffffffffffea80;
        popExpect(in_stack_ffffffffffffed38,in_stack_ffffffffffffed34,in_stack_ffffffffffffed28);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8);
        Token::~Token((Token *)in_stack_ffffffffffffe950);
      }
      local_579.kind._0_1_ = 0;
      local_598[0x1e] = '\0';
      std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
                ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                  *)0x20cc8d);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x20cc9a);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x20cca7);
      pTVar5 = peek((Parser *)0x20ccb4);
      if (pTVar5->kind == PAREN_L) {
        pop((Parser *)in_stack_ffffffffffffe968);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8);
        in_stack_ffffffffffffea78 = (Fodder *)local_6c1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffe990,(char *)in_stack_ffffffffffffe988,
                   (allocator<char> *)in_stack_ffffffffffffe980);
        parseParams(in_stack_ffffffffffffeab8,(string *)in_stack_ffffffffffffeab0,
                    (bool *)in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0);
        std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        operator=((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                   *)in_stack_ffffffffffffe960,
                  (vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                   *)in_stack_ffffffffffffe958);
        std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *
                )in_stack_ffffffffffffe960);
        std::__cxx11::string::~string((string *)(local_6c1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_6c1);
        local_579.kind._0_1_ = 1;
        Token::~Token((Token *)in_stack_ffffffffffffe950);
      }
      local_6c2 = ASSERT;
      popExpect(in_stack_ffffffffffffed38,in_stack_ffffffffffffed34,in_stack_ffffffffffffed28);
      local_7c0._48_8_ = std::__cxx11::string::c_str();
      if ((char)((pointer)local_7c0._48_8_)->kind == 0x2b) {
        local_6c2 = FIELD_ID;
        local_7c0._48_8_ = (long)&((pointer)local_7c0._48_8_)->kind + 1;
      }
      local_7c0._44_4_ = 0;
      for (; (char)*(Kind *)local_7c0._48_8_ != LINE_END;
          local_7c0._48_8_ = (long)(Kind *)local_7c0._48_8_ + 1) {
        if ((char)*(Kind *)local_7c0._48_8_ != 0x3a) {
          local_7c0[7] = 1;
          uVar3 = __cxa_allocate_exception(0x60);
          std::operator+((char *)in_stack_ffffffffffffe998,in_stack_ffffffffffffe990);
          StaticError::StaticError
                    (in_stack_ffffffffffffe970,(LocationRange *)in_stack_ffffffffffffe968,
                     &in_stack_ffffffffffffe960->file);
          local_7c0[7] = 0;
          __cxa_throw(uVar3,&StaticError::typeinfo,StaticError::~StaticError);
        }
        local_7c0._44_4_ = local_7c0._44_4_ + 1;
      }
      uVar9 = (undefined2)local_7c0._44_4_;
      in_stack_ffffffffffffea66 = SUB41(local_7c0._44_4_,2);
      in_stack_ffffffffffffea67 = SUB41(local_7c0._44_4_,3);
      if (local_7c0._44_4_ == 1) {
        local_7c0._0_4_ = FIELD_ID;
      }
      else if (local_7c0._44_4_ == 2) {
        local_7c0._0_4_ = ASSERT;
      }
      else {
        if (local_7c0._44_4_ != 3) {
          local_7e1 = 1;
          uVar3 = __cxa_allocate_exception(0x60);
          std::operator+((char *)in_stack_ffffffffffffe998,in_stack_ffffffffffffe990);
          StaticError::StaticError
                    (in_stack_ffffffffffffe970,(LocationRange *)in_stack_ffffffffffffe968,
                     &in_stack_ffffffffffffe960->file);
          local_7e1 = 0;
          __cxa_throw(uVar3,&StaticError::typeinfo,StaticError::~StaticError);
        }
        local_7c0._0_4_ = FIELD_EXPR;
      }
      if ((((undefined1)local_579.kind & 1) != 0) && ((local_6c2 & FIELD_ID) != ASSERT)) {
        local_809 = 1;
        uVar3 = __cxa_allocate_exception(0x60);
        std::operator+((char *)in_stack_ffffffffffffe998,in_stack_ffffffffffffe990);
        StaticError::StaticError
                  (in_stack_ffffffffffffe970,(LocationRange *)in_stack_ffffffffffffe968,
                   &in_stack_ffffffffffffe960->file);
        local_809 = 0;
        __cxa_throw(uVar3,&StaticError::typeinfo,StaticError::~StaticError);
      }
      if (local_350 != 2) {
        pVar6 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffe970,(value_type *)in_stack_ffffffffffffe968);
        local_830 = (_Base_ptr)pVar6.first._M_node;
        in_stack_ffffffffffffea37 = pVar6.second;
        local_828 = in_stack_ffffffffffffea37;
        local_820 = local_830;
        local_818 = in_stack_ffffffffffffea37;
        if (((in_stack_ffffffffffffea37 ^ 0xff) & 1) != 0) {
          local_878.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_right._7_1_
               = 1;
          uVar3 = __cxa_allocate_exception(0x60);
          std::operator+((char *)in_stack_ffffffffffffe998,in_stack_ffffffffffffe990);
          StaticError::StaticError
                    (in_stack_ffffffffffffe970,(LocationRange *)in_stack_ffffffffffffe968,
                     &in_stack_ffffffffffffe960->file);
          local_878.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_right._7_1_
               = 0;
          __cxa_throw(uVar3,&StaticError::typeinfo,StaticError::~StaticError);
        }
      }
      in_stack_ffffffffffffea18 =
           parse((Parser *)in_stack_ffffffffffffe9b8,
                 (uint)((ulong)in_stack_ffffffffffffe9b0 >> 0x20));
      local_878.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)in_stack_ffffffffffffea18;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x20d3d5);
      pop((Parser *)in_stack_ffffffffffffe968);
      Token::operator=((Token *)in_stack_ffffffffffffe950,(Token *)in_stack_ffffffffffffe948);
      Token::~Token((Token *)in_stack_ffffffffffffe950);
      if (local_160 == 4) {
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8);
        pop((Parser *)in_stack_ffffffffffffe968);
        Token::operator=((Token *)in_stack_ffffffffffffe950,(Token *)in_stack_ffffffffffffe948);
        Token::~Token((Token *)in_stack_ffffffffffffe950);
        local_99 = 1;
      }
      in_stack_ffffffffffffe988 = (Allocator *)(local_7c0 + 0x40);
      local_a00[0].file._M_dataplus = (_Alloc_hider)0x0;
      local_a00[0].file._1_7_ = 0;
      in_stack_ffffffffffffe9a0 = &local_878;
      in_stack_ffffffffffffe998 = local_a00;
      in_stack_ffffffffffffe990 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&local_878.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header + 0x10
           );
      in_stack_ffffffffffffe980 = (UString *)(local_598 + 0x1e);
      in_stack_ffffffffffffe978 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_598;
      in_stack_ffffffffffffe970 = &local_3d0;
      in_stack_ffffffffffffe968 = (AST *)local_360;
      in_stack_ffffffffffffe960 = (LocationRange *)&local_358;
      in_stack_ffffffffffffe958 = &local_579;
      in_stack_ffffffffffffe950 = (ObjectField *)&local_6c2;
      in_stack_ffffffffffffe948 = (value_type *)local_7c0;
      in_stack_ffffffffffffea10 = (TokenKind *)&stack0xffffffffffffe948;
      std::vector<jsonnet::internal::ObjectField,std::allocator<jsonnet::internal::ObjectField>>::
      emplace_back<jsonnet::internal::ObjectField::Kind&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::ObjectField::Hide&,bool&,bool&,jsonnet::internal::AST*&,jsonnet::internal::Identifier_const*&,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                ((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                  *)in_stack_ffffffffffffea20,(Kind *)in_stack_ffffffffffffea18,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)&stack0xffffffffffffe948,in_stack_ffffffffffffea08,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)in_stack_ffffffffffffea00,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)in_stack_ffffffffffffe9f8._M_node,
                 (Hide *)CONCAT17(in_stack_ffffffffffffea67,
                                  CONCAT16(in_stack_ffffffffffffea66,
                                           CONCAT24(uVar9,in_stack_ffffffffffffea60))),
                 (bool *)in_stack_ffffffffffffea68,(bool *)in_stack_ffffffffffffea70,
                 (AST **)in_stack_ffffffffffffea78,(Identifier **)in_stack_ffffffffffffea80,
                 (LocationRange *)in_stack_ffffffffffffea88,in_stack_ffffffffffffea90,
                 (bool *)in_stack_ffffffffffffea98,in_stack_ffffffffffffeaa0,
                 (AST **)in_stack_ffffffffffffeaa8,&in_stack_ffffffffffffeab0->_vptr_AST,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)in_stack_ffffffffffffeab8);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_ffffffffffffe960);
      Token::~Token((Token *)in_stack_ffffffffffffe950);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_ffffffffffffe960);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_ffffffffffffe960);
      std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
              in_stack_ffffffffffffe960);
      LocationRange::~LocationRange((LocationRange *)0x20d5c7);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_ffffffffffffe960);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_ffffffffffffe960);
    }
    else if (local_160 == 0x12) {
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_stack_ffffffffffffe9a0,
             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_stack_ffffffffffffe998);
      parse((Parser *)in_stack_ffffffffffffe9b8,(uint)((ulong)in_stack_ffffffffffffe9b0 >> 0x20));
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x20dd90);
      pTVar5 = peek((Parser *)0x20dd9d);
      if (pTVar5->kind == OPERATOR) {
        peek((Parser *)0x20ddb3);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffe950,(char *)in_stack_ffffffffffffe948);
        if (bVar1) {
          pop((Parser *)in_stack_ffffffffffffe968);
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::operator=(in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8);
          in_stack_ffffffffffffe9b8 =
               parse((Parser *)in_stack_ffffffffffffe9b8,
                     (uint)((ulong)in_stack_ffffffffffffe9b0 >> 0x20));
          Token::~Token((Token *)in_stack_ffffffffffffe950);
        }
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x20de97);
      pop((Parser *)in_stack_ffffffffffffe968);
      Token::operator=((Token *)in_stack_ffffffffffffe950,(Token *)in_stack_ffffffffffffe948);
      Token::~Token((Token *)in_stack_ffffffffffffe950);
      if (local_160 == 4) {
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8);
        pop((Parser *)in_stack_ffffffffffffe968);
        Token::operator=((Token *)in_stack_ffffffffffffe950,(Token *)in_stack_ffffffffffffe948);
        Token::~Token((Token *)in_stack_ffffffffffffe950);
        local_99 = 1;
      }
      ObjectField::Assert((Fodder *)in_stack_ffffffffffffeac8,in_stack_ffffffffffffeac0,
                          (Fodder *)in_stack_ffffffffffffeab8,in_stack_ffffffffffffeab0,
                          (Fodder *)in_stack_ffffffffffffeaa8);
      std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
      push_back((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                 *)in_stack_ffffffffffffe950,in_stack_ffffffffffffe948);
      ObjectField::~ObjectField(in_stack_ffffffffffffe950);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_ffffffffffffe960);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_ffffffffffffe960);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_ffffffffffffe960);
    }
    else {
      if (local_160 != 0x1d) {
        uVar3 = __cxa_allocate_exception(0x60);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffe990,(char *)in_stack_ffffffffffffe988,
                   (allocator<char> *)in_stack_ffffffffffffe980);
        unexpected((Parser *)CONCAT44(local_160,in_stack_ffffffffffffeb38),in_stack_ffffffffffffeb30
                   ,in_stack_ffffffffffffeb28);
        __cxa_throw(uVar3,&StaticError::typeinfo,StaticError::~StaticError);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_stack_ffffffffffffe9a0,
             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_stack_ffffffffffffe998);
      popExpect(in_stack_ffffffffffffed38,in_stack_ffffffffffffed34,in_stack_ffffffffffffed28);
      in_stack_ffffffffffffea08 =
           *(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             **)(in_RSI + 8);
      Token::data32_abi_cxx11_((Token *)in_stack_ffffffffffffe948);
      in_stack_ffffffffffffea00 =
           (value_type *)
           Allocator::makeIdentifier(in_stack_ffffffffffffe988,in_stack_ffffffffffffe980);
      std::__cxx11::u32string::~u32string
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 in_stack_ffffffffffffe950);
      local_b50.expr1 = (AST *)in_stack_ffffffffffffea00;
      in_stack_ffffffffffffe9f8 =
           std::
           set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
           ::find((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                   *)in_stack_ffffffffffffe958,(key_type *)in_stack_ffffffffffffe950);
      local_b50.fodderL.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffe9f8;
      local_b50.fodderL.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)std::
                    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                    ::end((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                           *)in_stack_ffffffffffffe948);
      bVar1 = std::operator!=((_Self *)&local_b50.fodderL.
                                        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (_Self *)&local_b50.fodderL.
                                        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                        ._M_impl.super__Vector_impl_data._M_finish);
      if (bVar1) {
        local_b50.fodder1.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        uVar3 = __cxa_allocate_exception(0x60);
        std::operator+((char *)in_stack_ffffffffffffe998,in_stack_ffffffffffffe990);
        StaticError::StaticError
                  (in_stack_ffffffffffffe970,(LocationRange *)in_stack_ffffffffffffe968,
                   &in_stack_ffffffffffffe960->file);
        local_b50.fodder1.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        __cxa_throw(uVar3,&StaticError::typeinfo,StaticError::~StaticError);
      }
      local_b50.fodder1.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      local_b50.fodder1.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
      std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
                ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                  *)0x20d89f);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x20d8ac);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x20d8b9);
      pTVar5 = peek((Parser *)0x20d8c6);
      if (pTVar5->kind == PAREN_L) {
        pop((Parser *)in_stack_ffffffffffffe968);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8);
        local_b50.fodder1.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffe990,(char *)in_stack_ffffffffffffe988,
                   (allocator<char> *)in_stack_ffffffffffffe980);
        parseParams(in_stack_ffffffffffffeab8,(string *)in_stack_ffffffffffffeab0,
                    (bool *)in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0);
        std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        operator=((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                   *)in_stack_ffffffffffffe960,
                  (vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                   *)in_stack_ffffffffffffe958);
        std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *
                )in_stack_ffffffffffffe960);
        std::__cxx11::string::~string(local_c78);
        std::allocator<char>::~allocator(&local_c79);
        Token::~Token((Token *)in_stack_ffffffffffffe950);
      }
      uVar8 = (undefined4)((ulong)in_stack_ffffffffffffe958 >> 0x20);
      popExpect(in_stack_ffffffffffffed38,in_stack_ffffffffffffed34,in_stack_ffffffffffffed28);
      local_d70._40_8_ =
           parse((Parser *)in_stack_ffffffffffffe9b8,
                 (uint)((ulong)in_stack_ffffffffffffe9b0 >> 0x20));
      pVar7 = std::
              set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
              ::insert((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                        *)in_stack_ffffffffffffe970,(value_type *)in_stack_ffffffffffffe968);
      local_d70._24_8_ = pVar7.first._M_node;
      local_d70[0x20] = pVar7.second;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x20dada);
      pop((Parser *)in_stack_ffffffffffffe968);
      Token::operator=((Token *)in_stack_ffffffffffffe950,(Token *)in_stack_ffffffffffffe948);
      Token::~Token((Token *)in_stack_ffffffffffffe950);
      if (local_160 == 4) {
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8);
        pop((Parser *)in_stack_ffffffffffffe968);
        Token::operator=((Token *)in_stack_ffffffffffffe950,(Token *)in_stack_ffffffffffffe948);
        Token::~Token((Token *)in_stack_ffffffffffffe950);
        local_99 = 1;
      }
      in_stack_ffffffffffffe960 = (LocationRange *)(local_d70 + 0x38);
      in_stack_ffffffffffffe970 = (StaticError *)local_d70;
      in_stack_ffffffffffffe958 =
           (Token *)(CONCAT44(uVar8,(uint)local_b50.fodder1.
                                          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_)
                    & 0xffffffff00000001);
      in_stack_ffffffffffffe950 = &local_b50;
      in_stack_ffffffffffffe948 = (value_type *)local_b50.expr1;
      in_stack_ffffffffffffe968 = (AST *)local_d70._40_8_;
      ObjectField::Local((Fodder *)in_stack_ffffffffffffea80,in_stack_ffffffffffffea78,
                         in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,
                         (bool)in_stack_ffffffffffffea67,(Identifier *)in_stack_ffffffffffffeac0,
                         (ArgParams *)in_stack_ffffffffffffeac8,(bool)in_stack_ffffffffffffea66,
                         in_stack_ffffffffffffead8,in_stack_ffffffffffffeae0,
                         (Fodder *)in_stack_ffffffffffffeae8);
      std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
      push_back((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                 *)in_stack_ffffffffffffe950,in_stack_ffffffffffffe948);
      ObjectField::~ObjectField(in_stack_ffffffffffffe950);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_ffffffffffffe960);
      Token::~Token((Token *)in_stack_ffffffffffffe950);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_ffffffffffffe960);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_ffffffffffffe960);
      std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
              in_stack_ffffffffffffe960);
      Token::~Token((Token *)in_stack_ffffffffffffe950);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_ffffffffffffe960);
    }
  } while( true );
}

Assistant:

Token parseObjectRemainder(AST *&obj, const Token &tok)
    {
        ObjectFields fields;
        std::set<std::string> literal_fields;  // For duplicate fields detection.
        std::set<const Identifier *> binds;    // For duplicate locals detection.

        bool got_comma = false;
        bool first = true;
        Token next = pop();

        do {
            if (next.kind == Token::BRACE_R) {
                obj = alloc->make<Object>(
                    span(tok, next), tok.fodder, fields, got_comma, next.fodder);
                return next;

            } else if (next.kind == Token::FOR) {
                // It's a comprehension
                unsigned num_fields = 0;
                unsigned num_asserts = 0;
                const ObjectField *field_ptr = nullptr;
                for (const auto &field : fields) {
                    if (field.kind == ObjectField::LOCAL)
                        continue;
                    if (field.kind == ObjectField::ASSERT) {
                        num_asserts++;
                        continue;
                    }
                    field_ptr = &field;
                    num_fields++;
                }
                if (num_asserts > 0) {
                    auto msg = "object comprehension cannot have asserts.";
                    throw StaticError(next.location, msg);
                }
                if (num_fields != 1) {
                    auto msg = "object comprehension can only have one field.";
                    throw StaticError(next.location, msg);
                }
                const ObjectField &field = *field_ptr;

                if (field.hide != ObjectField::INHERIT) {
                    auto msg = "object comprehensions cannot have hidden fields.";
                    throw StaticError(next.location, msg);
                }

                if (field.kind != ObjectField::FIELD_EXPR) {
                    auto msg = "object comprehensions can only have [e] fields.";
                    throw StaticError(next.location, msg);
                }

                std::vector<ComprehensionSpec> specs;
                Token last = parseComprehensionSpecs(Token::BRACE_R, next.fodder, specs);
                obj = alloc->make<ObjectComprehension>(
                    span(tok, last), tok.fodder, fields, got_comma, specs, last.fodder);

                return last;
            }

            if (!got_comma && !first)
                throw StaticError(next.location, "expected a comma before next field.");

            first = false;
            got_comma = false;

            switch (next.kind) {
                case Token::BRACKET_L:
                case Token::IDENTIFIER:
                case Token::STRING_DOUBLE:
                case Token::STRING_SINGLE:
                case Token::STRING_BLOCK:
                case Token::VERBATIM_STRING_DOUBLE:
                case Token::VERBATIM_STRING_SINGLE: {
                    ObjectField::Kind kind;
                    AST *expr1 = nullptr;
                    const Identifier *id = nullptr;
                    Fodder fodder1, fodder2;
                    LocationRange idLocation;
                    if (next.kind == Token::IDENTIFIER) {
                        fodder1 = next.fodder;
                        kind = ObjectField::FIELD_ID;
                        id = alloc->makeIdentifier(next.data32());
                        idLocation = next.location;
                    } else if (next.kind == Token::STRING_DOUBLE) {
                        kind = ObjectField::FIELD_STR;
                        expr1 = alloc->make<LiteralString>(next.location,
                                                           next.fodder,
                                                           next.data32(),
                                                           LiteralString::DOUBLE,
                                                           "",
                                                           "");
                    } else if (next.kind == Token::STRING_SINGLE) {
                        kind = ObjectField::FIELD_STR;
                        expr1 = alloc->make<LiteralString>(next.location,
                                                           next.fodder,
                                                           next.data32(),
                                                           LiteralString::SINGLE,
                                                           "",
                                                           "");
                    } else if (next.kind == Token::STRING_BLOCK) {
                        kind = ObjectField::FIELD_STR;
                        expr1 = alloc->make<LiteralString>(next.location,
                                                           next.fodder,
                                                           next.data32(),
                                                           LiteralString::BLOCK,
                                                           next.stringBlockIndent,
                                                           next.stringBlockTermIndent);
                    } else if (next.kind == Token::VERBATIM_STRING_SINGLE) {
                        kind = ObjectField::FIELD_STR;
                        expr1 = alloc->make<LiteralString>(next.location,
                                                           next.fodder,
                                                           next.data32(),
                                                           LiteralString::VERBATIM_SINGLE,
                                                           "",
                                                           "");
                    } else if (next.kind == Token::VERBATIM_STRING_DOUBLE) {
                        kind = ObjectField::FIELD_STR;
                        expr1 = alloc->make<LiteralString>(next.location,
                                                           next.fodder,
                                                           next.data32(),
                                                           LiteralString::VERBATIM_DOUBLE,
                                                           "",
                                                           "");
                    } else {
                        kind = ObjectField::FIELD_EXPR;
                        fodder1 = next.fodder;
                        expr1 = parse(MAX_PRECEDENCE);
                        Token bracket_r = popExpect(Token::BRACKET_R);
                        fodder2 = bracket_r.fodder;
                    }

                    bool is_method = false;
                    bool meth_comma = false;
                    ArgParams params;
                    Fodder fodder_l;
                    Fodder fodder_r;
                    if (peek().kind == Token::PAREN_L) {
                        Token paren_l = pop();
                        fodder_l = paren_l.fodder;
                        params = parseParams("method parameter", meth_comma, fodder_r);
                        is_method = true;
                    }

                    bool plus_sugar = false;

                    Token op = popExpect(Token::OPERATOR);
                    const char *od = op.data.c_str();
                    if (*od == '+') {
                        plus_sugar = true;
                        od++;
                    }
                    unsigned colons = 0;
                    for (; *od != '\0'; ++od) {
                        if (*od != ':') {
                            throw StaticError(
                                next.location,
                                "expected one of :, ::, :::, +:, +::, +:::, got: " + op.data);
                        }
                        ++colons;
                    }
                    ObjectField::Hide field_hide;
                    switch (colons) {
                        case 1: field_hide = ObjectField::INHERIT; break;

                        case 2: field_hide = ObjectField::HIDDEN; break;

                        case 3: field_hide = ObjectField::VISIBLE; break;

                        default:
                            throw StaticError(
                                next.location,
                                "expected one of :, ::, :::, +:, +::, +:::, got: " + op.data);
                    }

                    // Basic checks for invalid Jsonnet code.
                    if (is_method && plus_sugar) {
                        throw StaticError(next.location,
                                          "cannot use +: syntax sugar in a method: " + next.data);
                    }
                    if (kind != ObjectField::FIELD_EXPR) {
                        if (!literal_fields.insert(next.data).second) {
                            throw StaticError(next.location, "duplicate field: " + next.data);
                        }
                    }

                    AST *body = parse(MAX_PRECEDENCE);

                    Fodder comma_fodder;
                    next = pop();
                    if (next.kind == Token::COMMA) {
                        comma_fodder = next.fodder;
                        next = pop();
                        got_comma = true;
                    }
                    fields.emplace_back(kind,
                                        fodder1,
                                        fodder2,
                                        fodder_l,
                                        fodder_r,
                                        field_hide,
                                        plus_sugar,
                                        is_method,
                                        expr1,
                                        id,
                                        idLocation,
                                        params,
                                        meth_comma,
                                        op.fodder,
                                        body,
                                        nullptr,
                                        comma_fodder);
                } break;

                case Token::LOCAL: {
                    Fodder local_fodder = next.fodder;
                    Token var_id = popExpect(Token::IDENTIFIER);
                    auto *id = alloc->makeIdentifier(var_id.data32());

                    if (binds.find(id) != binds.end()) {
                        throw StaticError(var_id.location, "duplicate local var: " + var_id.data);
                    }
                    bool is_method = false;
                    bool func_comma = false;
                    ArgParams params;
                    Fodder paren_l_fodder;
                    Fodder paren_r_fodder;
                    if (peek().kind == Token::PAREN_L) {
                        Token paren_l = pop();
                        paren_l_fodder = paren_l.fodder;
                        is_method = true;
                        params = parseParams("function parameter", func_comma, paren_r_fodder);
                    }
                    Token eq = popExpect(Token::OPERATOR, "=");
                    AST *body = parse(MAX_PRECEDENCE);
                    binds.insert(id);

                    Fodder comma_fodder;
                    next = pop();
                    if (next.kind == Token::COMMA) {
                        comma_fodder = next.fodder;
                        next = pop();
                        got_comma = true;
                    }
                    fields.push_back(ObjectField::Local(local_fodder,
                                                        var_id.fodder,
                                                        paren_l_fodder,
                                                        paren_r_fodder,
                                                        is_method,
                                                        id,
                                                        params,
                                                        func_comma,
                                                        eq.fodder,
                                                        body,
                                                        comma_fodder));

                } break;

                case Token::ASSERT: {
                    Fodder assert_fodder = next.fodder;
                    AST *cond = parse(MAX_PRECEDENCE);
                    AST *msg = nullptr;
                    Fodder colon_fodder;
                    if (peek().kind == Token::OPERATOR && peek().data == ":") {
                        Token colon = pop();
                        colon_fodder = colon.fodder;
                        msg = parse(MAX_PRECEDENCE);
                    }

                    Fodder comma_fodder;
                    next = pop();
                    if (next.kind == Token::COMMA) {
                        comma_fodder = next.fodder;
                        next = pop();
                        got_comma = true;
                    }
                    fields.push_back(
                        ObjectField::Assert(assert_fodder, cond, colon_fodder, msg, comma_fodder));
                } break;

                default: throw unexpected(next, "parsing field definition");
            }

        } while (true);
    }